

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention_unittest.cc
# Opt level: O2

FileOptions * __thiscall
google::protobuf::compiler::anon_unknown_0::RetentionStripTest::
BuildDynamicProto<google::protobuf::FileOptions>
          (FileOptions *__return_storage_ptr__,RetentionStripTest *this,string_view data)

{
  bool bVar1;
  Descriptor *type;
  Message *this_00;
  MessageLite *this_01;
  Message *output;
  string_view sVar2;
  string_view data_00;
  string local_108;
  LogMessageFatal local_e8;
  DynamicMessageFactory factory;
  
  output = (Message *)data._M_str;
  FileOptions::FileOptions((FileOptions *)&factory);
  sVar2 = MessageLite::GetTypeName((MessageLite *)&factory);
  type = DescriptorPool::FindMessageTypeByName(&this->pool_,sVar2);
  FileOptions::~FileOptions((FileOptions *)&factory);
  DynamicMessageFactory::DynamicMessageFactory(&factory);
  this_00 = DynamicMessageFactory::GetPrototype(&factory,type);
  this_01 = &Message::New(this_00)->super_MessageLite;
  sVar2._M_str = (char *)this_01;
  sVar2._M_len = (size_t)data._M_str;
  bVar1 = TextFormat::ParseFromString((TextFormat *)data._M_len,sVar2,output);
  if (!bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
               ,0x5f,"TextFormat::ParseFromString(data, dynamic_message.get())");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_108);
  }
  FileOptions::FileOptions(__return_storage_ptr__);
  MessageLite::SerializeAsString_abi_cxx11_(&local_108,this_01);
  data_00._M_str = local_108._M_dataplus._M_p;
  data_00._M_len = local_108._M_string_length;
  bVar1 = MessageLite::ParseFromString((MessageLite *)__return_storage_ptr__,data_00);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_108);
    (*this_01->_vptr_MessageLite[1])(this_01);
    DynamicMessageFactory::~DynamicMessageFactory(&factory);
    return __return_storage_ptr__;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_e8,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
             ,0x61,"ret.ParseFromString(dynamic_message->SerializeAsString())");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_e8);
}

Assistant:

ProtoType BuildDynamicProto(absl::string_view data) {
    // We use a dynamic message to generate the expected options proto. This
    // lets us parse the custom options in text format.
    const Descriptor* file_options_descriptor =
        pool_.FindMessageTypeByName(ProtoType().GetTypeName());
    DynamicMessageFactory factory;
    std::unique_ptr<Message> dynamic_message(
        factory.GetPrototype(file_options_descriptor)->New());
    ABSL_CHECK(TextFormat::ParseFromString(data, dynamic_message.get()));
    ProtoType ret;
    ABSL_CHECK(ret.ParseFromString(dynamic_message->SerializeAsString()));
    return ret;
  }